

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.cpp
# Opt level: O1

IObjectConstructor * __thiscall
ObjectFactorySystem::GetConstructor(ObjectFactorySystem *this,char *type)

{
  const_iterator cVar1;
  IObjectConstructor *pIVar2;
  allocator<char> local_39;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,type,&local_39);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)&this->m_ConstructorIds,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (cVar1._M_node == (_Base_ptr)&this->field_0x10) {
    pIVar2 = (IObjectConstructor *)0x0;
  }
  else {
    pIVar2 = (this->m_Constructors).
             super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl
             .super__Vector_impl_data._M_start[*(long *)(cVar1._M_node + 2)];
  }
  return pIVar2;
}

Assistant:

IObjectConstructor* ObjectFactorySystem::GetConstructor( const char* type ) const
{
	CONSTRUCTORMAP::const_iterator found =  m_ConstructorIds.find( type );
	if( found != m_ConstructorIds.end() )
	{
		return m_Constructors[ found->second ];
	}
	return 0;
}